

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O1

VRDatumPtr __thiscall MinVR::CreateVRDatumFloat(MinVR *this,void *pData)

{
  VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *this_00;
  undefined4 *puVar1;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar2;
  
  this_00 = (VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> *)operator_new(0x68);
  VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2>::VRDatumSpecialized(this_00,*pData);
  (this_00->super_VRDatum)._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_00129940;
  *(VRDatumSpecialized<float,_(MinVR::VRCORETYPE_ID)2> **)this = this_00;
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 1;
  *(undefined4 **)(this + 8) = puVar1;
  VVar2.reference = extraout_RDX;
  VVar2.pData = (VRDatum_conflict *)this;
  return VVar2;
}

Assistant:

VRDatumPtr CreateVRDatumFloat(void *pData) {
  VRDatumFloat *obj = new VRDatumFloat(*static_cast<VRFloat *>(pData));
  return VRDatumPtr(obj);
}